

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ostream * smf::MidiFile::writeBigEndianFloat(ostream *out,float value)

{
  undefined1 local_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  anon_union_4_2_a3e1d9bc data;
  float value_local;
  ostream *out_local;
  
  uStack_15 = (char)((uint)value >> 0x18);
  std::operator<<(out,uStack_15);
  uStack_16 = (char)((uint)value >> 0x10);
  std::operator<<(out,uStack_16);
  uStack_17 = (char)((uint)value >> 8);
  std::operator<<(out,uStack_17);
  local_18 = SUB41(value,0);
  std::operator<<(out,local_18);
  return out;
}

Assistant:

std::ostream& MidiFile::writeBigEndianFloat(std::ostream& out, float value) {
	union { char bytes[4]; float f; } data;
	data.f = value;
	out << data.bytes[3];
	out << data.bytes[2];
	out << data.bytes[1];
	out << data.bytes[0];
	return out;
}